

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  pointer pcVar1;
  pointer pcVar2;
  cmOSXBundleGenerator *pcVar3;
  cmGeneratorTarget *this_00;
  TargetType TVar4;
  string *psVar5;
  cmOSXBundleGenerator *pcVar6;
  cmOSXBundleGenerator *local_120;
  string *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  cmGeneratorTarget *local_100;
  string *local_f8;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00639018;
  local_118 = (string *)&this->TargetNames;
  (this->TargetNames).Base._M_dataplus._M_p = (pointer)&(this->TargetNames).Base.field_2;
  (this->TargetNames).Base._M_string_length = 0;
  (this->TargetNames).Base.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Output._M_dataplus._M_p = (pointer)&(this->TargetNames).Output.field_2;
  (this->TargetNames).Output._M_string_length = 0;
  (this->TargetNames).Output.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Real._M_dataplus._M_p = (pointer)&(this->TargetNames).Real.field_2;
  (this->TargetNames).Real._M_string_length = 0;
  (this->TargetNames).Real.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).ImportLibrary._M_dataplus._M_p =
       (pointer)&(this->TargetNames).ImportLibrary.field_2;
  (this->TargetNames).ImportLibrary._M_string_length = 0;
  (this->TargetNames).ImportLibrary.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).PDB._M_dataplus._M_p = (pointer)&(this->TargetNames).PDB.field_2;
  (this->TargetNames).PDB._M_string_length = 0;
  (this->TargetNames).PDB.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).SharedObject._M_dataplus._M_p =
       (pointer)&(this->TargetNames).SharedObject.field_2;
  (this->TargetNames).SharedObject._M_string_length = 0;
  (this->TargetNames).SharedObject.field_2._M_local_buf[0] = '\0';
  local_f8 = (string *)&this->TargetLinkLanguage;
  local_108 = &(this->TargetLinkLanguage).field_2;
  (this->TargetLinkLanguage)._M_dataplus._M_p = (pointer)local_108;
  std::__cxx11::string::_M_construct<char_const*>(local_f8,"");
  local_110 = &(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)local_110;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_f0,target,psVar5);
  std::__cxx11::string::operator=(local_f8,(string *)local_f0);
  if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  TVar4 = cmGeneratorTarget::GetType(target);
  local_100 = target;
  if (TVar4 == EXECUTABLE) {
    cmGeneratorTarget::GetExecutableNames
              ((Names *)local_f0,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).ConfigName);
  }
  else {
    cmGeneratorTarget::GetLibraryNames
              ((Names *)local_f0,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).ConfigName);
  }
  std::__cxx11::string::operator=(local_118,(string *)local_f0);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).Output,(string *)&local_d0);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).Real,(string *)&local_b0);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).ImportLibrary,(string *)&local_90);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).PDB,(string *)&local_70);
  std::__cxx11::string::operator=((string *)&(this->TargetNames).SharedObject,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  this_00 = local_100;
  pcVar1 = local_f0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  TVar4 = cmGeneratorTarget::GetType(this_00);
  if (TVar4 != OBJECT_LIBRARY) {
    psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
    cmGeneratorTarget::GetDirectory((string *)local_f0,this_00,psVar5,RuntimeBinaryArtifact);
    cmNinjaTargetGenerator::EnsureDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)local_f0);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
  }
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  pcVar6 = (cmOSXBundleGenerator *)operator_new(0x40);
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar2,pcVar2 + psVar5->_M_string_length);
  cmOSXBundleGenerator::cmOSXBundleGenerator(pcVar6,this_00,(string *)local_f0);
  local_120 = pcVar6;
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  pcVar3 = local_120;
  local_120 = (cmOSXBundleGenerator *)0x0;
  pcVar6 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = pcVar3;
  if (pcVar6 != (cmOSXBundleGenerator *)0x0) {
    std::default_delete<cmOSXBundleGenerator>::operator()
              ((default_delete<cmOSXBundleGenerator> *)
               &(this->super_cmNinjaTargetGenerator).OSXBundleGenerator,pcVar6);
  }
  if (local_120 != (cmOSXBundleGenerator *)0x0) {
    std::default_delete<cmOSXBundleGenerator>::operator()
              ((default_delete<cmOSXBundleGenerator> *)&local_120,local_120);
  }
  ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator._M_t.
   super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
   super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
   super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl)->MacContentFolders =
       &(this->super_cmNinjaTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(
  cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetLinkLanguage("")
{
  this->TargetLinkLanguage = target->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    this->TargetNames = this->GetGeneratorTarget()->GetExecutableNames(
      GetLocalGenerator()->GetConfigName());
  } else {
    this->TargetNames = this->GetGeneratorTarget()->GetLibraryNames(
      GetLocalGenerator()->GetConfigName());
  }

  if (target->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->GetDirectory(this->GetConfigName()));
  }

  this->OSXBundleGenerator =
    cm::make_unique<cmOSXBundleGenerator>(target, this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}